

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  Ch *pCVar1;
  bool bVar2;
  Ch *pCVar3;
  undefined4 uVar4;
  
  pCVar1 = is->src_;
  pCVar3 = pCVar1 + 1;
  is->src_ = pCVar3;
  uVar4 = 3;
  if (pCVar1[1] == 'u') {
    pCVar3 = pCVar1 + 2;
    is->src_ = pCVar3;
    if (pCVar1[2] == 'l') {
      pCVar3 = pCVar1 + 3;
      is->src_ = pCVar3;
      if (pCVar1[3] == 'l') {
        is->src_ = pCVar1 + 4;
        bVar2 = VWReaderHandler<false>::Null(handler);
        if (bVar2) {
          return;
        }
        pCVar3 = is->src_;
        uVar4 = 0x10;
      }
    }
  }
  pCVar1 = is->head_;
  *(undefined4 *)(this + 0x30) = uVar4;
  *(long *)(this + 0x38) = (long)pCVar3 - (long)pCVar1;
  return;
}

Assistant:

void ParseNull(InputStream& is, Handler& handler)
  { RAPIDJSON_ASSERT(is.Peek() == 'n');
    is.Take();

    if (RAPIDJSON_LIKELY(Consume(is, 'u') && Consume(is, 'l') && Consume(is, 'l')))
    { if (RAPIDJSON_UNLIKELY(!handler.Null()))
        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
    }
    else
      RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
  }